

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osutils.cpp
# Opt level: O2

void * asmjit::OSUtils::allocVirtualMemory(size_t size,size_t *allocated,uint32_t flags)

{
  void *pvVar1;
  ulong __len;
  void *pvVar2;
  
  OSUtils_GetVMemInfo();
  __len = -_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 &
          (size - 1) + _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
  pvVar1 = mmap((void *)0x0,__len,(flags * 2 & 4) + 1 + (flags & 1) * 2,0x22,-1,0);
  pvVar2 = (void *)0x0;
  if ((pvVar1 != (void *)0xffffffffffffffff) && (pvVar2 = pvVar1, allocated != (size_t *)0x0)) {
    *allocated = __len;
  }
  return pvVar2;
}

Assistant:

void* OSUtils::allocVirtualMemory(size_t size, size_t* allocated, uint32_t flags) noexcept {
  const VMemInfo& vmi = OSUtils_GetVMemInfo();

  size_t alignedSize = Utils::alignTo<size_t>(size, vmi.pageSize);
  int protection = PROT_READ;

  if (flags & kVMWritable  ) protection |= PROT_WRITE;
  if (flags & kVMExecutable) protection |= PROT_EXEC;

  void* mbase = ::mmap(nullptr, alignedSize, protection, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
  if (ASMJIT_UNLIKELY(mbase == MAP_FAILED)) return nullptr;

  if (allocated) *allocated = alignedSize;
  return mbase;
}